

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O0

int Gia_ManInseHighestScore(Gia_Man_t *p,int *pCost)

{
  int iVar1;
  int iVar2;
  int *__ptr;
  word *pwVar3;
  int iVar4;
  bool bVar5;
  bool local_69;
  int local_50;
  int iPat;
  int nPats;
  int b;
  int k;
  int i;
  int CountBest;
  int *pCounts;
  word *pData1;
  word *pData0;
  Gia_Obj_t *pObj;
  int *pCost_local;
  Gia_Man_t *p_local;
  
  iVar1 = p->iData << 6;
  __ptr = (int *)calloc((long)iVar1,4);
  nPats = 0;
  while( true ) {
    iVar2 = Gia_ManRegNum(p);
    bVar5 = false;
    if (nPats < iVar2) {
      iVar2 = Gia_ManPoNum(p);
      pData0 = (word *)Gia_ManCo(p,iVar2 + nPats);
      bVar5 = (Gia_Obj_t *)pData0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar2 = Gia_ObjId(p,(Gia_Obj_t *)pData0);
    pwVar3 = Gia_ParTestObj(p,iVar2);
    iVar2 = p->iData;
    for (b = 0; b < p->iData; b = b + 1) {
      for (iPat = 0; iPat < 0x40; iPat = iPat + 1) {
        local_69 = true;
        if ((pwVar3[b] >> ((byte)iPat & 0x3f) & 1) == 0) {
          local_69 = (pwVar3[(long)iVar2 + (long)b] >> ((byte)iPat & 0x3f) & 1) != 0;
        }
        iVar4 = b * 0x40 + iPat;
        __ptr[iVar4] = (uint)local_69 + __ptr[iVar4];
      }
    }
    nPats = nPats + 1;
  }
  local_50 = 0;
  k = *__ptr;
  for (nPats = 1; nPats < iVar1; nPats = nPats + 1) {
    if (k < __ptr[nPats]) {
      k = __ptr[nPats];
      local_50 = nPats;
    }
  }
  iVar1 = Gia_ManRegNum(p);
  *pCost = iVar1 - k;
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  return local_50;
}

Assistant:

int Gia_ManInseHighestScore( Gia_Man_t * p, int * pCost )
{
    Gia_Obj_t * pObj;
    word * pData0, * pData1;
    int * pCounts, CountBest;
    int i, k, b, nPats, iPat;
    nPats = 64 * p->iData;
    pCounts = ABC_CALLOC( int, nPats );
    Gia_ManForEachRi( p, pObj, k )
    {
        pData0 = Gia_ParTestObj( p, Gia_ObjId(p, pObj) );
        pData1 = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            for ( b = 0; b < 64; b++ )
                pCounts[64*i+b] += (((pData0[i] >> b) & 1) || ((pData1[i] >> b) & 1)); // binary
    }
    iPat = 0;
    CountBest = pCounts[0]; 
    for ( k = 1; k < nPats; k++ )
        if ( CountBest < pCounts[k] )
            CountBest = pCounts[k], iPat = k;
    *pCost = Gia_ManRegNum(p) - CountBest; // ternary
    ABC_FREE( pCounts );
    return iPat;
}